

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

int vector_add_pos(uint32_t i,void *element,vector *vector)

{
  uint uVar1;
  uint32_t uVar2;
  void **ppvVar3;
  uint uVar4;
  ulong uVar5;
  
  ppvVar3 = vector->data;
  if (ppvVar3 == (void **)0x0) {
    uVar2 = vector->size;
    if (uVar2 == 0) {
      vector->size = 0x80;
      uVar2 = 0x80;
    }
    ppvVar3 = (void **)(*mixed_calloc)((size_t)uVar2,8);
    vector->count = 0;
  }
  while( true ) {
    if (ppvVar3 == (void **)0x0) {
      mixed_err(1);
      return 0;
    }
    uVar4 = vector->size;
    if (i < uVar4) break;
    ppvVar3 = (void **)crealloc(vector->data,(ulong)uVar4,(ulong)(uVar4 * 2),8);
    if (ppvVar3 != (void **)0x0) {
      vector->size = vector->size << 1;
    }
  }
  uVar1 = vector->count;
  uVar4 = uVar1 + 1;
  uVar5 = (ulong)uVar4;
  while (i < uVar5) {
    ppvVar3[uVar5] = ppvVar3[uVar5 - 1 & 0xffffffff];
    uVar5 = uVar5 - 1;
  }
  ppvVar3[i] = element;
  vector->data = ppvVar3;
  if (uVar1 < i) {
    uVar4 = i;
  }
  vector->count = uVar4;
  return 1;
}

Assistant:

int vector_add_pos(uint32_t i, void *element, struct vector *vector){
  void **data = vector->data;
  // Not yet initialised
  if(!data){
    if(vector->size == 0) vector->size = BASE_VECTOR_SIZE;
    data = mixed_calloc(vector->size, sizeof(void *));
    vector->count = 0;
  }
  // Too small
  while(data && vector->size <= i){
    data = crealloc(vector->data, vector->size, vector->size*2, sizeof(void *));
    if(data) vector->size *= 2;
  }
  // Check completeness
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }
  // Shift
  for(uint32_t j=vector->count+1; i<j; --j){
    data[j] = data[j-1];
  }
  data[i] = element;
  vector->data = data;
  vector->count = (vector->count < i)? i : vector->count+1;
  return 1;
}